

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

TiXmlElement * __thiscall despot::Parser::GetParameterElement(Parser *this,TiXmlElement *element)

{
  undefined8 uVar1;
  bool condition;
  char *pcVar2;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string param_type;
  TiXmlElement *e_Parameter;
  TiXmlElement *element_local;
  Parser *this_local;
  
  param_type.field_2._8_8_ =
       util::tinyxml::TiXmlNode::FirstChildElement(&element->super_TiXmlNode,"Parameter");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"",&local_41);
  std::allocator<char>::~allocator(&local_41);
  pcVar2 = util::tinyxml::TiXmlElement::Attribute((TiXmlElement *)param_type.field_2._8_8_,"type");
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::operator=((string *)local_40,"TBL");
  }
  else {
    pcVar2 = util::tinyxml::TiXmlElement::Attribute((TiXmlElement *)param_type.field_2._8_8_,"type")
    ;
    std::__cxx11::string::operator=((string *)local_40,pcVar2);
  }
  condition = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"TBL");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Only parameter type \"TBL\" is supported.\n",&local_79);
  Ensure(this,condition,&local_78,(TiXmlBase *)0x0);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  uVar1 = param_type.field_2._8_8_;
  std::__cxx11::string::~string((string *)local_40);
  return (TiXmlElement *)uVar1;
}

Assistant:

TiXmlElement* Parser::GetParameterElement(TiXmlElement* element) {
	TiXmlElement* e_Parameter = element->FirstChildElement("Parameter");

	string param_type = "";
	if (e_Parameter->Attribute("type") == NULL)
		param_type = "TBL"; //the default case
	else
		param_type = e_Parameter->Attribute("type");

	Ensure(param_type == "TBL", "Only parameter type \"TBL\" is supported.\n");

	return e_Parameter;
}